

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,3,2>,tcu::Vector<float,2>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  bool *pbVar1;
  _Rb_tree_node_base *p_Var2;
  ostringstream *poVar3;
  ostream *poVar4;
  pointer pVVar5;
  pointer pVVar6;
  Variable<tcu::Vector<float,_3>_> *pVVar7;
  pointer pcVar8;
  Variable<tcu::Matrix<float,_3,_2>_> *pVVar9;
  Variable<tcu::Vector<float,_2>_> *pVVar10;
  double dVar11;
  PrecisionCase *pPVar12;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
  *pVVar13;
  FloatFormat *fmt;
  undefined8 uVar14;
  bool bVar15;
  bool bVar16;
  ContextType type;
  int iVar17;
  _Rb_tree_node_base *p_Var18;
  char *pcVar19;
  size_t sVar20;
  long *plVar21;
  ShaderExecutor *pSVar22;
  long lVar23;
  IVal *pIVar24;
  IVal *pIVar25;
  IVal *pIVar26;
  TestError *this_00;
  uint uVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  undefined1 *puVar29;
  Vector<float,_3> *val;
  long lVar30;
  Interval *__return_storage_ptr__;
  undefined8 *puVar31;
  long lVar32;
  byte bVar33;
  IVal in2;
  FuncSet funcs;
  IVal in3;
  IVal in1;
  ostringstream os;
  FloatFormat highpFmt;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
  outputs;
  ShaderSpec spec;
  ostringstream oss;
  PrecisionCase *local_548;
  undefined1 local_540 [12];
  undefined4 uStack_534;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  ulong local_520;
  undefined1 local_518 [16];
  undefined1 local_508 [24];
  double local_4f0;
  double local_4d0;
  Statement *local_4c8;
  ulong local_4c0;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
  *local_4b8;
  string local_4b0;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_490;
  undefined1 local_488 [32];
  double local_468;
  double dStack_460;
  ResultCollector *local_458;
  long local_450;
  undefined1 local_448 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  double local_428;
  Data DStack_420;
  undefined4 local_410;
  ios_base local_3d8 [8];
  ios_base local_3d0 [264];
  FloatFormat local_2c8;
  ulong local_298;
  FloatFormat *local_290;
  long local_288;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_280;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
  local_250;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar33 = 0;
  pVVar5 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar6 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_4d0 = (double)(((long)pVVar6 - (long)pVVar5 >> 2) * -0x5555555555555555);
  local_4c8 = stmt;
  local_490 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_2>_>_>
  ::Outputs(&local_250,(size_t)local_4d0);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_2c8.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_2c8.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_2c8.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_2c8.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_2c8.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_2c8.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_2c8.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_2c8.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_2c8._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_280._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_280._M_impl.super__Rb_tree_header._M_header;
  local_280._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_280._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_280._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_448._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_448 + 8);
  local_280._M_impl.super__Rb_tree_header._M_header._M_right =
       local_280._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  (*local_4c8->_vptr_Statement[2])(local_4c8,poVar3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_548 = this;
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_3d0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var2 = (_Rb_tree_node_base *)(local_518 + 8);
  local_518._8_4_ = _S_red;
  local_508._0_8_ = (_Base_ptr)0x0;
  local_4f0 = 0.0;
  local_508._8_8_ = p_Var2;
  local_508._16_8_ = p_Var2;
  (*local_4c8->_vptr_Statement[4])(local_4c8,local_518);
  if ((_Rb_tree_node_base *)local_508._8_8_ != p_Var2) {
    p_Var18 = (_Rb_tree_node_base *)local_508._8_8_;
    do {
      (**(code **)(**(long **)(p_Var18 + 1) + 0x30))(*(long **)(p_Var18 + 1),local_1a8);
      p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
    } while (p_Var18 != p_Var2);
  }
  pPVar12 = local_548;
  if (local_4f0 != 0.0) {
    local_448._0_8_ = ((local_548->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_448 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(char *)local_488._0_8_,local_488._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
      operator_delete((void *)local_488._0_8_,(ulong)(local_488._16_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_3d0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_518);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,"precision ",10);
  pcVar19 = glu::getPrecisionName((pPVar12->m_ctx).precision);
  if (pcVar19 == (char *)0x0) {
    std::ios::clear((int)((long)&local_548 + *(long *)(local_448._0_8_ + -0x18)) + 0x100);
  }
  else {
    sVar20 = strlen(pcVar19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,pcVar19,sVar20);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar8 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar8) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_448);
  std::ios_base::~ios_base(local_3d8);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_548->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  local_4b8 = variables;
  if ((local_548->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_548->m_extension);
    plVar21 = (long *)std::__cxx11::string::append(local_1a8);
    paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar21 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar21 == paVar28) {
      local_438._M_allocated_capacity = paVar28->_M_allocated_capacity;
      local_438._8_8_ = plVar21[3];
      local_448._0_8_ = &local_438;
    }
    else {
      local_438._M_allocated_capacity = paVar28->_M_allocated_capacity;
      local_448._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar21;
    }
    local_448._8_8_ = plVar21[1];
    *plVar21 = (long)paVar28;
    plVar21[1] = 0;
    *(undefined1 *)(plVar21 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_448);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._0_8_ != &local_438) {
      operator_delete((void *)local_448._0_8_,local_438._M_allocated_capacity + 1);
    }
    variables = local_4b8;
    if ((pointer)local_1a8._0_8_ != pcVar8) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),1);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_448,local_548,
             (variables->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar14 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_448);
  glu::VarType::operator=((VarType *)(uVar14 + 0x20),(VarType *)&local_428);
  glu::VarType::~VarType((VarType *)&local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._0_8_ != &local_438) {
    operator_delete((void *)local_448._0_8_,local_438._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_448,local_548,
             (variables->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar14 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_448);
  glu::VarType::operator=(&((pointer)(uVar14 + 0x38))->varType,(VarType *)&local_428);
  glu::VarType::~VarType((VarType *)&local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._0_8_ != &local_438) {
    operator_delete((void *)local_448._0_8_,local_438._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Matrix<float,3,2>>
            ((Symbol *)local_448,local_548,
             (variables->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr);
  uVar14 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_448);
  glu::VarType::operator=((VarType *)(uVar14 + 0x20),(VarType *)&local_428);
  glu::VarType::~VarType((VarType *)&local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._0_8_ != &local_438) {
    operator_delete((void *)local_448._0_8_,local_438._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
  (*local_4c8->_vptr_Statement[2])(local_4c8,local_448);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_448);
  std::ios_base::~ios_base(local_3d8);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar8) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar12 = local_548;
  pSVar22 = ShaderExecUtil::createExecutor
                      ((local_548->m_ctx).renderContext,(local_548->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  local_448._0_8_ =
       (local_490->in0).
       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_448._8_8_ =
       (local_490->in1).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_438._M_allocated_capacity =
       (size_type)
       (local_490->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_438._8_8_ =
       (local_490->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_250.out0.
       super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_250.out1.
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar22->_vptr_ShaderExecutor[3])
            (pSVar22,((pPVar12->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar17 = (*pSVar22->_vptr_ShaderExecutor[2])(pSVar22);
  if ((char)iVar17 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar22->_vptr_ShaderExecutor[5])(pSVar22);
  (*pSVar22->_vptr_ShaderExecutor[6])(pSVar22,local_4d0,local_448,local_1a8);
  local_290 = &(pPVar12->m_ctx).floatFormat;
  (*pSVar22->_vptr_ShaderExecutor[1])(pSVar22);
  lVar23 = 0x10;
  do {
    local_1b8._M_local_buf[lVar23] = '\0';
    *(undefined8 *)(local_1a8 + lVar23 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar23) = 0xfff0000000000000;
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x58);
  lVar23 = 0x10;
  do {
    local_1b8._M_local_buf[lVar23] = '\0';
    *(undefined8 *)(local_1a8 + lVar23 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar23) = 0xfff0000000000000;
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x58);
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_448);
  lVar23 = 0x10;
  do {
    local_530._M_local_buf[lVar23 + 8] = '\0';
    *(undefined8 *)((long)&local_520 + lVar23) = 0x7ff0000000000000;
    *(undefined8 *)(local_518 + lVar23) = 0xfff0000000000000;
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x40);
  lVar23 = 0x10;
  do {
    local_530._M_local_buf[lVar23 + 8] = '\0';
    *(undefined8 *)((long)&local_520 + lVar23) = 0x7ff0000000000000;
    *(undefined8 *)(local_518 + lVar23) = 0xfff0000000000000;
    lVar23 = lVar23 + 0x18;
  } while (lVar23 == 0x28);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_280,
             (variables->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_280,
             (variables->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_488);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_280,
             (variables->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_540);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_280,
             (variables->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_4b0);
  Environment::bind<tcu::Matrix<float,3,2>>
            ((Environment *)&local_280,
             (variables->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr,(IVal *)local_448);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_280,
             (variables->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_518);
  if (pVVar6 == pVVar5) {
    local_4c0 = 0;
  }
  else {
    local_458 = &local_548->m_status;
    local_298 = (long)local_4d0 + (ulong)(local_4d0 == 0.0);
    local_520 = 0;
    local_4c0 = 0;
    do {
      tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_1a8);
      lVar23 = 0x10;
      do {
        local_4b0.field_2._M_local_buf[lVar23 + 8] = '\0';
        *(undefined8 *)((long)&local_490 + lVar23) = 0x7ff0000000000000;
        *(undefined8 *)(local_488 + lVar23) = 0xfff0000000000000;
        lVar23 = lVar23 + 0x18;
      } while (lVar23 != 0x40);
      lVar23 = 0x10;
      do {
        local_4b0.field_2._M_local_buf[lVar23 + 8] = '\0';
        *(undefined8 *)((long)&local_490 + lVar23) = 0x7ff0000000000000;
        *(undefined8 *)(local_488 + lVar23) = 0xfff0000000000000;
        lVar23 = lVar23 + 0x18;
      } while (lVar23 == 0x28);
      if ((local_520 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_548->super_TestCase).super_TestNode.m_testCtx);
      }
      fmt = local_290;
      pVVar5 = (local_490->in0).
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_450 = local_520 * 3;
      local_540._8_4_ = pVVar5[local_520].m_data[2];
      local_540._0_8_ = *(undefined8 *)pVVar5[local_520].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_518,local_290,(Vector<float,_3> *)local_540);
      pVVar13 = local_4b8;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_448,fmt,(IVal *)local_518);
      pIVar24 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_280,
                           (pVVar13->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      puVar31 = (undefined8 *)local_448;
      for (lVar23 = 9; lVar23 != 0; lVar23 = lVar23 + -1) {
        *(undefined8 *)pIVar24->m_data = *puVar31;
        puVar31 = puVar31 + (ulong)bVar33 * -2 + 1;
        pIVar24 = (IVal *)((long)pIVar24 + ((ulong)bVar33 * -2 + 1) * 8);
      }
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_280,
                 (pVVar13->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_280,
                 (pVVar13->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_280,
                 (pVVar13->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      DStack_420.basic.type = (local_548->m_ctx).precision;
      local_428 = fmt->m_maxValue;
      local_448._0_8_ = *(undefined8 *)fmt;
      local_448._8_8_ = *(undefined8 *)&fmt->m_fractionBits;
      local_438._M_allocated_capacity = *(undefined8 *)&fmt->m_hasInf;
      local_438._8_8_ = *(undefined8 *)&fmt->m_exactPrecision;
      local_410 = 0;
      DStack_420._8_8_ = &local_280;
      (*local_4c8->_vptr_Statement[3])(local_4c8,(IVal *)local_448);
      pIVar25 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_280,
                           (pVVar13->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_448,&local_2c8,pIVar25);
      dStack_460 = (double)CONCAT44(DStack_420.basic.precision,DStack_420.basic.type);
      local_468 = local_428;
      local_488._16_8_ = local_438._M_allocated_capacity;
      local_488._24_8_ = local_438._8_8_;
      local_488._0_8_ = local_448._0_8_;
      local_488._8_8_ = local_448._8_8_;
      local_288 = local_520 * 8;
      bVar15 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                         ((IVal *)local_488,
                          local_250.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_520);
      local_448._0_8_ = &local_438;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_448,"Shader output 1 is outside acceptable range","");
      bVar15 = tcu::ResultCollector::check(local_458,bVar15,(string *)local_448);
      pVVar13 = local_4b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._0_8_ != &local_438) {
        operator_delete((void *)local_448._0_8_,(ulong)(local_438._M_allocated_capacity + 1));
      }
      pIVar26 = Environment::lookup<tcu::Matrix<float,3,2>>
                          ((Environment *)&local_280,
                           (pVVar13->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                           .m_ptr);
      __return_storage_ptr__ = (Interval *)local_448;
      ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doConvert
                ((IVal *)__return_storage_ptr__,&local_2c8,pIVar26);
      lVar23 = local_450;
      puVar29 = local_1a8;
      lVar30 = 0;
      do {
        lVar32 = 0;
        do {
          *(undefined8 *)(puVar29 + lVar32 + 0x10) =
               *(undefined8 *)((long)&__return_storage_ptr__->m_hi + lVar32);
          pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_3>,_2> *)&__return_storage_ptr__->m_hasNaN)
                    ->m_data[0].m_data[0].m_hasNaN + lVar32;
          dVar11 = *(double *)(pbVar1 + 8);
          *(undefined8 *)(puVar29 + lVar32) = *(undefined8 *)pbVar1;
          *(double *)((long)(puVar29 + lVar32) + 8) = dVar11;
          lVar32 = lVar32 + 0x48;
        } while (lVar32 == 0x48);
        lVar30 = lVar30 + 1;
        puVar29 = puVar29 + 0x18;
        __return_storage_ptr__ = __return_storage_ptr__ + 1;
      } while (lVar30 != 3);
      bVar16 = contains<tcu::Matrix<float,3,2>>
                         ((IVal *)local_1a8,
                          (Matrix<float,_3,_2> *)
                          (((local_250.out0.
                             super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                          local_450 * 2));
      local_448._0_8_ = &local_438;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_448,"Shader output 0 is outside acceptable range","");
      bVar16 = tcu::ResultCollector::check(local_458,bVar16,(string *)local_448);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._0_8_ != &local_438) {
        operator_delete((void *)local_448._0_8_,(ulong)(local_438._M_allocated_capacity + 1));
      }
      pVVar13 = local_4b8;
      uVar27 = (int)local_4c0 + ((byte)~(bVar15 && bVar16) & 1);
      local_4c0 = (ulong)uVar27;
      if ((int)uVar27 < 0x65 && (!bVar15 || !bVar16)) {
        local_448._0_8_ = ((local_548->super_TestCase).super_TestNode.m_testCtx)->m_log;
        poVar3 = (ostringstream *)(local_448 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar3);
        pcVar19 = "Failed";
        if (bVar15 && bVar16) {
          pcVar19 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar19,6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar7 = (pVVar13->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                 .m_ptr;
        val = (Vector<float,_3> *)local_508;
        pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
        local_518._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_518,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_448 + 8),(char *)local_518._0_8_,
                   CONCAT44(local_518._12_4_,local_518._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_448 + 8)," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_540,(BuiltinPrecisionTests *)&local_2c8,
                   (FloatFormat *)
                   (((local_490->in0).
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + local_450),val);
        poVar4 = (ostream *)(local_448 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(char *)local_540._0_8_,CONCAT44(uStack_534,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._0_8_ != &local_530) {
          operator_delete((void *)local_540._0_8_,local_530._M_allocated_capacity + 1);
        }
        if ((Vector<float,_3> *)local_518._0_8_ != (Vector<float,_3> *)local_508) {
          operator_delete((void *)local_518._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_508._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        pVVar9 = (pVVar13->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                 .m_ptr;
        pIVar26 = (IVal *)local_508;
        pcVar8 = (pVVar9->m_name)._M_dataplus._M_p;
        local_518._0_8_ = pIVar26;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_518,pcVar8,pcVar8 + (pVVar9->m_name)._M_string_length);
        poVar4 = (ostream *)(local_448 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(char *)local_518._0_8_,CONCAT44(local_518._12_4_,local_518._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
        valueToString<tcu::Matrix<float,3,2>>
                  ((string *)local_540,(BuiltinPrecisionTests *)&local_2c8,
                   (FloatFormat *)
                   (((local_250.out0.
                      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar23 * 2),(Matrix<float,_3,_2> *)pIVar26);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(char *)local_540._0_8_,CONCAT44(uStack_534,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,3,2>>
                  (&local_4b0,(BuiltinPrecisionTests *)&local_2c8,(FloatFormat *)local_1a8,pIVar26);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,local_4b0._M_dataplus._M_p,local_4b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._0_8_ != &local_530) {
          operator_delete((void *)local_540._0_8_,local_530._M_allocated_capacity + 1);
        }
        if ((IVal *)local_518._0_8_ != (IVal *)local_508) {
          operator_delete((void *)local_518._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_508._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        pVVar10 = (pVVar13->out1).
                  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                  .m_ptr;
        pIVar25 = (IVal *)local_508;
        pcVar8 = (pVVar10->m_name)._M_dataplus._M_p;
        local_518._0_8_ = pIVar25;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_518,pcVar8,pcVar8 + (pVVar10->m_name)._M_string_length);
        poVar4 = (ostream *)(local_448 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(char *)local_518._0_8_,CONCAT44(local_518._12_4_,local_518._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)local_540,(BuiltinPrecisionTests *)&local_2c8,
                   (FloatFormat *)
                   ((long)(local_250.out1.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_288),
                   (Vector<float,_2> *)pIVar25);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(char *)local_540._0_8_,CONCAT44(uStack_534,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,2>>
                  (&local_4b0,(BuiltinPrecisionTests *)&local_2c8,(FloatFormat *)local_488,pIVar25);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,local_4b0._M_dataplus._M_p,local_4b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._0_8_ != &local_530) {
          operator_delete((void *)local_540._0_8_,local_530._M_allocated_capacity + 1);
        }
        if ((IVal *)local_518._0_8_ != (IVal *)local_508) {
          operator_delete((void *)local_518._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_508._0_8_ + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_448 + 8));
        std::ios_base::~ios_base(local_3d0);
      }
      local_520 = local_520 + 1;
    } while (local_520 != local_298);
  }
  pPVar12 = local_548;
  iVar17 = (int)local_4c0;
  if (100 < iVar17) {
    local_448._0_8_ = ((local_548->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_448 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
    std::ostream::operator<<(poVar3,iVar17 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_3d0);
  }
  if (iVar17 == 0) {
    local_448._0_8_ = ((pPVar12->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_448 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_448._0_8_ = ((pPVar12->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_448 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_448 + 8));
  std::ios_base::~ios_base(local_3d0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_250.out1.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out1.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_250.out0.
      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}